

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

stack_item * stack_peek_n(stack *stack,size_t index)

{
  _Bool _Var1;
  bool bVar2;
  ulong local_30;
  size_t i;
  stack_item *curr;
  size_t index_local;
  stack *stack_local;
  
  _Var1 = stack_has_item(stack);
  if ((_Var1) && (index <= stack->length)) {
    i = (size_t)stack->head;
    local_30 = 0;
    while( true ) {
      bVar2 = false;
      if ((local_30 < index) && (bVar2 = false, i != 0)) {
        bVar2 = *(long *)i != 0;
      }
      if (!bVar2) break;
      i = *(size_t *)i;
      local_30 = local_30 + 1;
    }
    stack_local = (stack *)i;
  }
  else {
    stack_local = (stack *)0x0;
  }
  return (stack_item *)stack_local;
}

Assistant:

const struct stack_item *stack_peek_n(const struct stack *stack, size_t index)
{
        if (!stack_has_item(stack) || stack->length < index) {
                return NULL;
        }

        struct stack_item *curr = stack->head;
        size_t i = 0;

        while (i < index && curr != NULL && curr->next != NULL) {
                curr = curr->next;

                ++i;
        }

        return curr;
}